

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

VIterator __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::vfind
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  VIterator ppVar1;
  VIterator ppVar2;
  VIterator ppVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar8;
  undefined1 auVar7 [16];
  
  iVar6 = (int)V;
  ppVar3 = (VIterator)
           (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
           super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
           super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.BeginX;
  uVar4 = (ulong)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                 super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                 super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
                 Size;
  ppVar1 = ppVar3 + uVar4;
  lVar5 = uVar4 << 3;
  while ((ppVar2 = ppVar1, lVar5 != 0 &&
         (auVar7._0_4_ = -(uint)((*ppVar3).first == (*V).first),
         iVar8 = -(uint)((*ppVar3).second == (*V).second), auVar7._4_4_ = auVar7._0_4_,
         auVar7._8_4_ = iVar8, auVar7._12_4_ = iVar8, iVar6 = movmskpd(iVar6,auVar7),
         ppVar2 = ppVar3, iVar6 != 3))) {
    ppVar3 = ppVar3 + 1;
    lVar5 = lVar5 + -8;
  }
  return ppVar2;
}

Assistant:

begin() const { return (const_iterator)this->BeginX; }